

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector4D.cpp
# Opt level: O1

ostream * CMU462::operator<<(ostream *os,Vector4D *v)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"(",1);
  poVar1 = std::ostream::_M_insert<double>(v->x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = std::ostream::_M_insert<double>(v->y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = std::ostream::_M_insert<double>(v->z);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = std::ostream::_M_insert<double>(v->w);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  return os;
}

Assistant:

std::ostream& operator<<( std::ostream& os, const Vector4D& v ) {
    os << "(" << v.x << "," << v.y << "," << v.z << "," << v.w << ")";
    return os;
  }